

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclPrintBuffersOne(SC_Man *p,Abc_Obj_t *pObj,int nOffset)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  
  iVar6 = nOffset;
  if (nOffset < 1) {
    uVar8 = 0;
  }
  else {
    do {
      printf("    ");
      iVar6 = iVar6 + -1;
      uVar8 = nOffset;
    } while (iVar6 != 0);
  }
  uVar1 = pObj->Id;
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 2) {
    pcVar9 = "pi";
  }
  else {
    pcVar9 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  }
  uVar2 = (pObj->vFanouts).nSize;
  iVar6 = Abc_SclCountBufferFanoutsInt(pObj);
  iVar7 = 0;
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    iVar7 = -(uint)((pObj->vFanins).nSize == 1);
  }
  uVar5 = Abc_SclCountNonBufferFanouts(pObj);
  printf("%6d: %-16s (%2d:%3d:%3d)  ",(ulong)uVar1,pcVar9,(ulong)uVar2,(ulong)(uint)(iVar7 + iVar6),
         (ulong)uVar5);
  if (uVar8 < 4) {
    iVar6 = uVar8 - 4;
    do {
      printf("    ");
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  dVar12 = 0.0;
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 2) {
LAB_00477a35:
    printf("a =%5.2f  ",dVar12);
    printf("d = (");
    printf("%6.0f ps; ",(double)p->pTimes[(uint)pObj->Id].rise);
    printf("%6.0f ps)  ",(double)p->pTimes[(uint)pObj->Id].fall);
    fVar10 = p->pLoads[(uint)pObj->Id].rise;
    fVar13 = p->pLoads[(uint)pObj->Id].fall;
    if (fVar10 <= fVar13) {
      fVar10 = fVar13;
    }
    printf("l =%5.0f ff  ",(double)fVar10);
    fVar10 = p->pSlews[(uint)pObj->Id].rise;
    fVar13 = p->pSlews[(uint)pObj->Id].fall;
    if (fVar10 <= fVar13) {
      fVar10 = fVar13;
    }
    printf("s =%5.0f ps   ",(double)fVar10);
    uVar8 = pObj->Id;
    fVar10 = p->pTimes[uVar8].rise + p->pDepts[uVar8].rise;
    fVar13 = p->pTimes[uVar8].fall + p->pDepts[uVar8].fall;
    if (fVar10 <= fVar13) {
      fVar10 = fVar13;
    }
    printf("sl =%5.0f ps   ",(double)(p->MaxDelay0 - fVar10));
    if (nOffset == 0) {
      fVar10 = Abc_SclCountNonBufferLoad(p,pObj);
      printf("L =%5.0f ff   ",(double)fVar10);
      fVar10 = Abc_SclCountNonBufferLoad(p,pObj);
      printf("Lx =%5.0f ff  ",((double)fVar10 * 100.0) / (double)p->EstLoadAve);
      fVar10 = Abc_SclCountNonBufferDelay(p,pObj);
      iVar6 = Abc_SclCountNonBufferFanouts(pObj);
      printf("Dx =%5.0f ps  ",
             (double)(fVar10 / (float)iVar6) - (double)p->pTimes[(uint)pObj->Id].rise);
      fVar13 = Abc_SclCountNonBufferDelay(p,pObj);
      iVar6 = Abc_SclCountNonBufferFanouts(pObj);
      fVar10 = p->pTimes[(uint)pObj->Id].rise;
      fVar11 = Abc_SclCountNonBufferLoad(p,pObj);
      dVar12 = log((double)(fVar11 / p->EstLoadAve));
      printf("Cx =%5.0f ps",((double)(fVar13 / (float)iVar6) - (double)fVar10) / dVar12);
    }
    putchar(10);
    return;
  }
  iVar6 = pObj->Id;
  if (-1 < (long)iVar6) {
    pVVar3 = pObj->pNtk->vGates;
    if (iVar6 < pVVar3->nSize) {
      iVar6 = pVVar3->pArray[iVar6];
      if (((long)iVar6 < 0) || (pvVar4 = pObj->pNtk->pSCLib, *(int *)((long)pvVar4 + 100) <= iVar6))
      {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      dVar12 = (double)*(float *)(*(long *)(*(long *)((long)pvVar4 + 0x68) + (long)iVar6 * 8) + 0x18
                                 );
      goto LAB_00477a35;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_SclPrintBuffersOne( SC_Man * p, Abc_Obj_t * pObj, int nOffset )
{
    int i;
    for ( i = 0; i < nOffset; i++ )
        printf( "    " );
    printf( "%6d: %-16s (%2d:%3d:%3d)  ", 
        Abc_ObjId(pObj), 
        Abc_ObjIsPi(pObj) ? "pi" : Mio_GateReadName((Mio_Gate_t *)pObj->pData), 
        Abc_ObjFanoutNum(pObj), 
        Abc_SclCountBufferFanouts(pObj), 
        Abc_SclCountNonBufferFanouts(pObj) );
    for ( ; i < 4; i++ )
        printf( "    " );
    printf( "a =%5.2f  ",      Abc_ObjIsPi(pObj) ? 0 : Abc_SclObjCell(pObj)->area );
    printf( "d = (" );
    printf( "%6.0f ps; ",      Abc_SclObjTimeOne(p, pObj, 1) );
    printf( "%6.0f ps)  ",     Abc_SclObjTimeOne(p, pObj, 0) );
    printf( "l =%5.0f ff  ",   Abc_SclObjLoadMax(p, pObj) );
    printf( "s =%5.0f ps   ",  Abc_SclObjSlewMax(p, pObj) );
    printf( "sl =%5.0f ps   ", Abc_SclObjSlackMax(p, pObj, p->MaxDelay0) );
    if ( nOffset == 0 )
    {
    printf( "L =%5.0f ff   ",  Abc_SclCountNonBufferLoad(p, pObj) );
    printf( "Lx =%5.0f ff  ",  100.0*Abc_SclCountNonBufferLoad(p, pObj)/p->EstLoadAve );
    printf( "Dx =%5.0f ps  ",  Abc_SclCountNonBufferDelay(p, pObj)/Abc_SclCountNonBufferFanouts(pObj) - Abc_SclObjTimeOne(p, pObj, 1) );
    printf( "Cx =%5.0f ps",    (Abc_SclCountNonBufferDelay(p, pObj)/Abc_SclCountNonBufferFanouts(pObj) - Abc_SclObjTimeOne(p, pObj, 1))/log(Abc_SclCountNonBufferLoad(p, pObj)/p->EstLoadAve) );
    }
    printf( "\n" );
}